

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_sectors.cpp
# Opt level: O1

void __thiscall sector_t::TransferSpecial(sector_t *this,sector_t *model)

{
  this->special = model->special;
  this->damageamount = model->damageamount;
  (this->damagetype).super_FName.Index = (model->damagetype).super_FName.Index;
  this->damageinterval = model->damageinterval;
  this->leakydamage = model->leakydamage;
  this->Flags = model->Flags & 0x7b0 | this->Flags & 0xfffff84f;
  return;
}

Assistant:

void sector_t::TransferSpecial(sector_t *model)
{
	special = model->special;
	damageamount = model->damageamount;
	damagetype = model->damagetype;
	damageinterval = model->damageinterval;
	leakydamage = model->leakydamage;
	Flags = (Flags&~SECF_SPECIALFLAGS) | (model->Flags & SECF_SPECIALFLAGS);
}